

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

void __thiscall GlobOpt::EndTrackCall(GlobOpt *this,Instr *instr)

{
  uint *puVar1;
  OpCode OVar2;
  Opnd *this_00;
  _func_int **pp_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  BasicBlock *pBVar11;
  Type *ppOVar12;
  StackSym *pSVar13;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  Instr *this_02;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a0,"(instr)","instr");
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
  }
  bVar5 = OpCodeAttr::CallInstr(instr->m_opcode);
  if ((!bVar5) &&
     ((uVar7 = instr->m_opcode - 0x248, 0x21 < uVar7 ||
      ((0x200000023U >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a2,
                       "(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)"
                       ,
                       "OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee"
                      );
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
  }
  if ((this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a4,"(!this->isCallHelper)","!this->isCallHelper");
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
  }
  pBVar11 = this->currentBlock;
  this_01 = (pBVar11->globOptData).callSequence;
  if ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
      (this_01->super_SListNodeBase<Memory::ArenaAllocator>).next == this_01) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3a5,"(!this->currentBlock->globOptData.callSequence->Empty())",
                       "!this->currentBlock->globOptData.callSequence->Empty()");
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
    pBVar11 = this->currentBlock;
    this_01 = (pBVar11->globOptData).callSequence;
  }
  uVar9 = (pBVar11->globOptData).argOutCount;
  while( true ) {
    ppOVar12 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head(this_01);
    pSVar13 = IR::Opnd::GetStackSym(*ppOVar12);
    if ((pSVar13->field_0x1a & 0x30) == 0) break;
    pBVar11 = this->currentBlock;
    puVar1 = &(pBVar11->globOptData).argOutCount;
    *puVar1 = *puVar1 - 1;
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
              ((pBVar11->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
    this_01 = (this->currentBlock->globOptData).callSequence;
  }
  ppOVar12 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                       ((this->currentBlock->globOptData).callSequence);
  this_00 = *ppOVar12;
  OVar6 = IR::Opnd::GetKind(this_00);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
  }
  pp_Var3 = this_00[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
  }
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            ((this->currentBlock->globOptData).callSequence,&this->alloc->super_ArenaAllocator);
  if (((ulong)pp_Var3[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b4,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
  }
  this_02 = (Instr *)pp_Var3[5];
  if (this_02->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3b5,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                       "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_0048bf30;
    *puVar10 = 0;
    this_02 = (Instr *)pp_Var3[5];
  }
  uVar7 = 1;
  uVar8 = IR::Instr::GetArgOutCount(this_02,true);
  OVar2 = instr->m_opcode;
  if (((OVar2 != NewScObject) && (OVar2 != NewScObjArray)) && (OVar2 != NewScObjectSpread)) {
    uVar7 = (uint)(OVar2 == NewScObjArraySpread);
  }
  if (uVar8 != (uVar9 - (this->currentBlock->globOptData).argOutCount) + uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3bc,
                       "((uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread))"
                       ,
                       "(uint)sym->m_instrDef->GetArgOutCount( true) == origArgOutCount - this->currentBlock->globOptData.argOutCount + (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread)"
                      );
    if (!bVar5) {
LAB_0048bf30:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  uVar9 = IR::Instr::GetArgOutCount((Instr *)pp_Var3[5],true);
  pBVar11 = this->currentBlock;
  puVar1 = &(pBVar11->globOptData).totalOutParamCount;
  *puVar1 = *puVar1 - uVar9;
  puVar1 = &(pBVar11->globOptData).startCallCount;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

void GlobOpt::EndTrackCall(IR::Instr* instr)
{
    Assert(instr);
    Assert(OpCodeAttr::CallInstr(instr->m_opcode) || instr->m_opcode == Js::OpCode::InlineeStart || instr->m_opcode == Js::OpCode::InlineBuiltInEnd
        || instr->m_opcode == Js::OpCode::InlineArrayPop || instr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee);

    Assert(!this->isCallHelper);
    Assert(!this->currentBlock->globOptData.callSequence->Empty());


#if DBG
    uint origArgOutCount = this->currentBlock->globOptData.argOutCount;
#endif
    while (this->currentBlock->globOptData.callSequence->Head()->GetStackSym()->HasArgSlotNum())
    {
        this->currentBlock->globOptData.argOutCount--;
        this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);
    }
    StackSym * sym = this->currentBlock->globOptData.callSequence->Head()->AsRegOpnd()->m_sym->AsStackSym();
    this->currentBlock->globOptData.callSequence->RemoveHead(this->alloc);

#if DBG
    Assert(sym->m_isSingleDef);
    Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

    // Number of argument set should be the same as indicated at StartCall
    // except NewScObject has an implicit arg1
    Assert((uint)sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true) ==
        origArgOutCount - this->currentBlock->globOptData.argOutCount +
           (instr->m_opcode == Js::OpCode::NewScObject || instr->m_opcode == Js::OpCode::NewScObjArray
           || instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread));

#endif

    this->currentBlock->globOptData.totalOutParamCount -= sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
    this->currentBlock->globOptData.startCallCount--;
}